

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

Var __thiscall
Js::CustomExternalWrapperObject::GetName
          (CustomExternalWrapperObject *this,ScriptContext *requestContext,PropertyId propertyId,
          Var *isPropertyNameNumeric,Var *propertyNameNumericValue)

{
  JavascriptLibrary *pJVar1;
  uint32 nValue;
  PropertyRecord *propertyRecord;
  PropertyString *pPVar2;
  Var pvVar3;
  
  propertyRecord = ThreadContext::GetPropertyName(requestContext->threadContext,propertyId);
  if (propertyRecord->isSymbol == true) {
    pPVar2 = (PropertyString *)ScriptContext::GetSymbol(requestContext,propertyRecord);
  }
  else {
    pPVar2 = ScriptContext::GetPropertyString(requestContext,propertyRecord);
  }
  pJVar1 = (requestContext->super_ScriptContextBase).javascriptLibrary;
  if (propertyRecord->isNumeric == false) {
    *isPropertyNameNumeric = (pJVar1->super_JavascriptLibraryBase).booleanFalse.ptr;
    pvVar3 = (Var)0x0;
  }
  else {
    *isPropertyNameNumeric = (pJVar1->super_JavascriptLibraryBase).booleanTrue.ptr;
    nValue = PropertyRecord::GetNumericValue(propertyRecord);
    pvVar3 = JavascriptNumber::ToVar(nValue,requestContext);
  }
  *propertyNameNumericValue = pvVar3;
  return pPVar2;
}

Assistant:

Js::Var CustomExternalWrapperObject::GetName(Js::ScriptContext* requestContext, Js::PropertyId propertyId, Var * isPropertyNameNumeric, Var * propertyNameNumericValue)
{
    const Js::PropertyRecord* propertyRecord = requestContext->GetThreadContext()->GetPropertyName(propertyId);
    Js::Var name;
    if (propertyRecord->IsSymbol())
    {
        name = requestContext->GetSymbol(propertyRecord);
    }
    else
    {
        name = requestContext->GetPropertyString(propertyRecord);
    }

    *isPropertyNameNumeric = propertyRecord->IsNumeric() ? requestContext->GetLibrary()->GetTrue() : requestContext->GetLibrary()->GetFalse();
    *propertyNameNumericValue = propertyRecord->IsNumeric() ? JavascriptNumber::ToVar(propertyRecord->GetNumericValue(), requestContext) : nullptr;
    return name;
}